

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O1

void __thiscall addrman_tests::caddrinfo_get_new_bucket::test_method(caddrinfo_get_new_bucket *this)

{
  size_type *psVar1;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 uVar11;
  char *pcVar12;
  iterator in_R8;
  iterator pvVar13;
  char *pcVar14;
  iterator in_R9;
  iterator pvVar15;
  long in_FS_OFFSET;
  bool bVar16;
  span<const_std::byte,_18446744073709551615UL> source;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  check_type cVar17;
  char *local_6b8;
  char *local_6b0;
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  uint local_628;
  int local_624;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  vector<bool,_std::allocator<bool>_> local_540;
  NetGroupManager ngm_asmap;
  vector<bool,_std::allocator<bool>_> asmap;
  direct_or_indirect local_4c0;
  uint local_4b0;
  undefined1 *local_4a8;
  uint16_t local_4a0;
  direct_or_indirect local_498;
  uint local_488;
  undefined1 *local_480;
  uint16_t local_478;
  string local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  uint local_440;
  direct_or_indirect local_430;
  uint local_420;
  undefined1 *local_418;
  uint16_t local_410;
  undefined1 local_408 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  direct_or_indirect local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  direct_or_indirect local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_398;
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_378;
  direct_or_indirect local_368;
  uint local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_350;
  uint16_t local_348;
  int bucket;
  undefined4 uStack_33c;
  undefined8 local_338;
  shared_count sStack_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_328;
  uint16_t local_320;
  NodeSeconds local_318;
  ServiceFlags local_310;
  AddrInfo infoi;
  set<int,_std::less<int>,_std::allocator<int>_> buckets;
  AddrInfo info2;
  uint256 nKey2;
  uint256 nKey1;
  AddrInfo info1;
  CNetAddr source1;
  direct_or_indirect local_f8;
  uint local_e8;
  Network local_e0;
  uint32_t uStack_dc;
  uint16_t local_d8;
  CAddress addr2;
  direct_or_indirect local_98;
  uint local_88;
  Network local_80;
  uint32_t uStack_7c;
  uint16_t local_78;
  CAddress addr1;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  source._M_extent._M_extent_value = 0x3b;
  source._M_ptr = test::data::detail_asmap_raw;
  FromBytes(&asmap,source);
  std::vector<bool,_std::allocator<bool>_>::vector(&local_540,&asmap);
  ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage =
       local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset =
       local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._12_4_ =
       local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._12_4_;
  ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p =
       local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset =
       local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_offset;
  ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._12_4_ =
       local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._12_4_;
  local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  psVar1 = &info1.super_CAddress.super_CService.super_CNetAddr.m_addr._size;
  info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&info1,"250.1.2.1","");
  ResolveService((CService *)&local_98.indirect_contents,(string *)&info1,0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98.indirect_contents);
  addr1.super_CService.super_CNetAddr.m_net = local_80;
  addr1.super_CService.super_CNetAddr.m_scope_id = uStack_7c;
  addr1.super_CService.port = local_78;
  addr1.nTime.__d.__r = (duration)100000000;
  addr1.nServices = NODE_NONE;
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((size_type *)
      info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar1) {
    operator_delete(info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.
                    indirect_contents.indirect,
                    CONCAT44(info1.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_,
                             info1.super_CAddress.super_CService.super_CNetAddr.m_addr._size) + 1);
  }
  info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&info1,"250.1.2.1","");
  ResolveService((CService *)&local_f8.indirect_contents,(string *)&info1,9999);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents);
  addr2.super_CService.super_CNetAddr.m_net = local_e0;
  addr2.super_CService.super_CNetAddr.m_scope_id = uStack_dc;
  addr2.super_CService.port = local_d8;
  addr2.nTime.__d.__r = (duration)100000000;
  addr2.nServices = NODE_NONE;
  if (0x10 < local_e8) {
    free(local_f8.indirect_contents.indirect);
    local_f8.indirect_contents.indirect = (char *)0x0;
  }
  if ((size_type *)
      info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar1) {
    operator_delete(info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.
                    indirect_contents.indirect,
                    CONCAT44(info1.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_,
                             info1.super_CAddress.super_CService.super_CNetAddr.m_addr._size) + 1);
  }
  info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&info1,"250.1.2.1","");
  ResolveIP(&source1,(string *)&info1);
  if ((size_type *)
      info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar1) {
    operator_delete(info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.
                    indirect_contents.indirect,
                    CONCAT44(info1.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_,
                             info1.super_CAddress.super_CService.super_CNetAddr.m_addr._size) + 1);
  }
  AddrInfo::AddrInfo(&info1,&addr1,&source1);
  info2.source.m_addr._union._8_8_ = 0;
  info2.source.m_addr._size = 0;
  info2.source.m_addr._20_4_ = 0;
  info2.m_last_count_attempt.__d.__r = (duration)0;
  info2.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
  info2.super_CAddress.nServices = NODE_NONE;
  info2.m_last_try.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.port = 0;
  info2.super_CAddress.super_CService._34_6_ = 0;
  info2.super_CAddress.nTime.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._size = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_net = NET_UNROUTABLE;
  info2.super_CAddress.super_CService.super_CNetAddr.m_scope_id = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)0x0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  info2.source.m_net = NET_UNROUTABLE;
  info2.source.m_scope_id = 0;
  CSHA256::CSHA256((CSHA256 *)&info2);
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._0_4_ = 1;
  CSHA256::Write((CSHA256 *)&info2,(uchar *)&infoi,4);
  HashWriter::GetHash(&nKey1,(HashWriter *)&info2);
  info2.source.m_addr._union._8_8_ = 0;
  info2.source.m_addr._size = 0;
  info2.source.m_addr._20_4_ = 0;
  info2.m_last_count_attempt.__d.__r = (duration)0;
  info2.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
  info2.super_CAddress.nServices = NODE_NONE;
  info2.m_last_try.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.port = 0;
  info2.super_CAddress.super_CService._34_6_ = 0;
  info2.super_CAddress.nTime.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._size = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_net = NET_UNROUTABLE;
  info2.super_CAddress.super_CService.super_CNetAddr.m_scope_id = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)0x0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  info2.source.m_net = NET_UNROUTABLE;
  info2.source.m_scope_id = 0;
  CSHA256::CSHA256((CSHA256 *)&info2);
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._0_4_ = 2;
  CSHA256::Write((CSHA256 *)&info2,(uchar *)&infoi,4);
  HashWriter::GetHash(&nKey2,(HashWriter *)&info2);
  local_550 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x28c;
  file.m_begin = (iterator)&local_550;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_560,msg);
  local_338 = local_338 & 0xffffffffffffff00;
  _bucket = &PTR__lazy_ostream_013abb30;
  sStack_330.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0xf6cf21;
  local_3e8._M_allocated_capacity._0_4_ =
       AddrInfo::GetNewBucket(&info1,&nKey1,&info1.source,&ngm_asmap);
  local_3a8.indirect_contents.indirect = (char *)&local_3e8;
  local_3c8.indirect_contents.indirect = local_408;
  local_408._0_4_ = 0x31b;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_388._8_8_ = "";
  info2.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_3a8;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "@;\x1f";
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_3c8;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "@;\x1f";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  pvVar13 = (iterator)0x1;
  pvVar15 = (iterator)0x2;
  buckets._M_t._M_impl._0_1_ = local_3e8._M_allocated_capacity._0_4_ == 0x31b;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&buckets,(lazy_ostream *)&bucket,1,2,REQUIRE,0xe53bbf,
             (size_t)local_388,0x28c,&info2,"795",&infoi);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_568 = "";
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x28d;
  file_00.m_begin = (iterator)&local_570;
  msg_00.m_end = pvVar15;
  msg_00.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_580,
             msg_00);
  local_338 = local_338 & 0xffffffffffffff00;
  _bucket = &PTR__lazy_ostream_013abb30;
  sStack_330.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0xf6cf21;
  local_3e8._M_allocated_capacity._0_4_ = AddrInfo::GetNewBucket(&info1,&nKey1,&source1,&ngm_asmap);
  local_408._0_4_ = 0x31b;
  buckets._M_t._M_impl._0_1_ = local_3e8._M_allocated_capacity._0_4_ == 0x31b;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_388._8_8_ = "";
  local_3a8.indirect_contents.indirect = (char *)&local_3e8;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "@;\x1f";
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  info2.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_3a8;
  local_3c8.indirect_contents.indirect = local_408;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "@;\x1f";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_3c8;
  pvVar13 = (iterator)0x1;
  pvVar15 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&buckets,(lazy_ostream *)&bucket,1,2,REQUIRE,0xe53be4,
             (size_t)local_388,0x28d,&info2,"795",&infoi);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_590 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_588 = "";
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x291;
  file_01.m_begin = (iterator)&local_590;
  msg_01.m_end = pvVar15;
  msg_01.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_5a0,
             msg_01);
  iVar5 = AddrInfo::GetNewBucket(&info1,&nKey1,&info1.source,&ngm_asmap);
  _cVar17 = 0x23cb0b;
  iVar6 = AddrInfo::GetNewBucket(&info1,&nKey2,&info1.source,&ngm_asmap);
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.direct[0] = iVar5 != iVar6;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._size = 0;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  _bucket = (undefined **)0xe53c12;
  local_338 = (long)"info1.GetNewBucket(nKey1, ngm_asmap) != info1.GetNewBucket(nKey2, ngm_asmap)" +
              0x4c;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "@;\x1f";
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_5b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5a8 = "";
  pvVar13 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  info2.super_CAddress.super_CService.super_CNetAddr._24_8_ = (lazy_ostream *)&bucket;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&infoi,(lazy_ostream *)&info2,1,0,WARN,_cVar17,(size_t)&local_5b0,
             0x291);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._size);
  AddrInfo::AddrInfo(&info2,&addr2,&source1);
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x295;
  file_02.m_begin = (iterator)&local_5c0;
  msg_02.m_end = pvVar15;
  msg_02.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_5d0,
             msg_02);
  CService::GetKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buckets,
                   (CService *)&info1);
  _cVar17 = 0x23cc28;
  CService::GetKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_388,
                   (CService *)&info2);
  bVar16 = true;
  if (buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ - buckets._M_t._M_impl._0_8_ ==
      local_388._8_8_ - local_388._0_8_) {
    if (buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == buckets._M_t._M_impl._0_8_) {
      bVar16 = false;
    }
    else {
      _cVar17 = 0x23cc62;
      iVar5 = bcmp((void *)buckets._M_t._M_impl._0_8_,(void *)local_388._0_8_,
                   buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
                   buckets._M_t._M_impl._0_8_);
      bVar16 = iVar5 != 0;
    }
  }
  bucket._0_1_ = bVar16;
  local_338 = (element_type *)0x0;
  sStack_330.pi_ = (sp_counted_base *)0x0;
  local_3a8.indirect_contents.indirect = "info1.GetKey() != info2.GetKey()";
  local_3a8._8_8_ = (long)"info1.GetKey() != info2.GetKey()" + 0x20;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "@;\x1f";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_3a8;
  local_5e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5d8 = "";
  pvVar13 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&bucket,(lazy_ostream *)&infoi,1,0,WARN,_cVar17,(size_t)&local_5e0,
             0x295);
  boost::detail::shared_count::~shared_count(&sStack_330);
  if ((pointer)local_388._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_388._0_8_,aStack_378._M_allocated_capacity - local_388._0_8_);
  }
  if (buckets._M_t._M_impl._0_8_ != 0) {
    operator_delete((void *)buckets._M_t._M_impl._0_8_,
                    (long)buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent -
                    buckets._M_t._M_impl._0_8_);
  }
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x296;
  file_03.m_begin = (iterator)&local_5f0;
  msg_03.m_end = pvVar15;
  msg_03.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_600,
             msg_03);
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  buckets._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abb30;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf6cf21;
  iVar5 = AddrInfo::GetNewBucket(&info1,&nKey1,&info1.source,&ngm_asmap);
  local_408._0_4_ = iVar5;
  local_450._M_allocated_capacity._0_4_ =
       AddrInfo::GetNewBucket(&info2,&nKey1,&info2.source,&ngm_asmap);
  local_3e8._M_allocated_capacity = (size_type)&local_450;
  local_388[0] = local_408._0_4_ == local_450._M_allocated_capacity._0_4_;
  local_388._8_8_ = (element_type *)0x0;
  aStack_378._M_allocated_capacity = 0;
  local_3a8.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3a8._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_3c8.indirect_contents.indirect = local_408;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "@;\x1f";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_3c8;
  local_338 = local_338 & 0xffffffffffffff00;
  _bucket = &PTR__lazy_ostream_013abcf0;
  sStack_330.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_328 = &local_3e8;
  pvVar13 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_388,(lazy_ostream *)&buckets,1,2,REQUIRE,0xe53bbf,
             (size_t)&local_3a8,0x296,&infoi,"info2.GetNewBucket(nKey1, ngm_asmap)",
             (assertion_result *)&bucket);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_378._M_allocated_capacity);
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &buckets._M_t._M_impl.super__Rb_tree_header._M_header;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  buckets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_450._M_allocated_capacity = (ulong)(uint)local_450._M_allocated_capacity._4_4_ << 0x20;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    util::ToString<int>((string *)&local_3a8,(int *)local_450._M_local_buf);
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace((string *)&local_3a8,0,0,"250.1.1.",8);
    local_388._0_8_ = &aStack_378;
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar7->_M_dataplus)._M_p;
    paVar8 = &pbVar7->field_2;
    if (paVar3 == paVar8) {
      aStack_378._M_allocated_capacity = paVar8->_M_allocated_capacity;
      aStack_378._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    }
    else {
      aStack_378._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_388._0_8_ = paVar3;
    }
    local_388._8_8_ = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    ResolveService((CService *)&local_368.indirect_contents,(string *)local_388,0);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_368.indirect_contents);
    local_328 = local_350;
    local_320 = local_348;
    local_318.__d.__r = (duration)100000000;
    local_310 = NODE_NONE;
    util::ToString<int>((string *)local_408,(int *)local_450._M_local_buf);
    pvVar15 = &DAT_00000008;
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace((string *)local_408,0,0,"250.1.1.",8);
    local_3e8._M_allocated_capacity = (size_type)&local_3d8;
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar7->_M_dataplus)._M_p;
    paVar8 = &pbVar7->field_2;
    if (paVar3 == paVar8) {
      local_3d8._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_3d8._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    }
    else {
      local_3d8._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_3e8._M_allocated_capacity = (size_type)paVar3;
    }
    local_3e8._8_8_ = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    ResolveIP((CNetAddr *)&local_3c8,(string *)&local_3e8);
    AddrInfo::AddrInfo(&infoi,(CAddress *)&bucket,(CNetAddr *)&local_3c8);
    if (0x10 < (uint)local_3b8._M_allocated_capacity._0_4_) {
      free(local_3c8.indirect_contents.indirect);
      local_3c8.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_allocated_capacity != &local_3d8) {
      operator_delete((void *)local_3e8._M_allocated_capacity,local_3d8._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
      operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
    }
    if (0x10 < (uint)sStack_330.pi_) {
      free(_bucket);
      _bucket = (_func_int **)0x0;
    }
    if (0x10 < local_358) {
      free(local_368.indirect_contents.indirect);
      local_368.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._0_8_ != &aStack_378) {
      operator_delete((void *)local_388._0_8_,(ulong)(aStack_378._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.indirect_contents.indirect != &aStack_398) {
      operator_delete(local_3a8.indirect_contents.indirect,aStack_398._M_allocated_capacity + 1);
    }
    iVar5 = AddrInfo::GetNewBucket(&infoi,&nKey1,&infoi.source,&ngm_asmap);
    bucket = iVar5;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&buckets,
               &bucket);
    if (0x10 < infoi.source.m_addr._size) {
      free(infoi.source.m_addr._union.indirect_contents.indirect);
      infoi.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
    }
    if (0x10 < infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._size) {
      free(infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
           indirect);
      infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
           (char *)0x0;
    }
    uVar4 = local_450._M_allocated_capacity._0_4_;
    local_450._M_allocated_capacity._0_4_ = local_450._M_allocated_capacity._0_4_ + 1;
  } while ((int)uVar4 < 0xfe);
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x2a2;
  file_04.m_begin = (iterator)&local_610;
  msg_04.m_end = pvVar13;
  msg_04.m_begin = pvVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_620,
             msg_04);
  uVar10 = 0;
  local_388._8_8_ = local_388._8_8_ & 0xffffffffffffff00;
  local_388._0_8_ = &PTR__lazy_ostream_013abb30;
  aStack_378._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_378._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_450._M_allocated_capacity = buckets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_408._0_8_ = &local_470;
  local_470._M_dataplus._M_p._0_4_ = 1;
  local_3a8.direct[0] = buckets._M_t._M_impl.super__Rb_tree_header._M_node_count == 1;
  local_3a8._8_8_ = (element_type *)0x0;
  aStack_398._M_allocated_capacity = 0;
  local_3c8.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3c8._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_3e8._M_allocated_capacity = (size_type)&local_450;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "@;\x1f";
  infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_3e8;
  local_338 = local_338 & 0xffffffffffffff00;
  _bucket = &PTR__lazy_ostream_013abbb0;
  sStack_330.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408;
  pvVar13 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,2,REQUIRE,0xfb9bf2,
             (size_t)&local_3c8,0x2a2,&infoi,"1U",(CAddress *)&bucket);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_398._M_allocated_capacity);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&buckets._M_t);
  do {
    local_624 = (int)(uVar10 / 0xff) + 0xfa;
    util::ToString<int>((string *)&local_3e8,&local_624);
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_3e8,".");
    local_3c8.indirect_contents.indirect = (char *)&local_3b8;
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar7->_M_dataplus)._M_p;
    paVar8 = &pbVar7->field_2;
    if (paVar3 == paVar8) {
      local_3b8._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_3b8._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    }
    else {
      local_3b8._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_3c8.indirect_contents.indirect = (char *)paVar3;
    }
    local_3c8._8_8_ = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    local_628 = (uint)uVar10 & 0xff;
    util::ToString<int>((string *)local_408,(int *)&local_628);
    uVar11 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8.indirect_contents.indirect != &local_3b8) {
      uVar11 = local_3b8._M_allocated_capacity;
    }
    pcVar14 = (char *)local_3c8._8_8_;
    if ((ulong)uVar11 < (char *)(local_408._8_8_ + local_3c8._8_8_)) {
      pcVar12 = (char *)0xf;
      if ((string *)local_408._0_8_ != (string *)(local_408 + 0x10)) {
        pcVar12 = (char *)local_408._16_8_;
      }
      if (pcVar12 < (char *)(local_408._8_8_ + local_3c8._8_8_)) goto LAB_0023d50a;
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_408,0,0,local_3c8.indirect_contents.indirect,local_3c8._8_8_);
    }
    else {
LAB_0023d50a:
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_3c8,(char *)local_408._0_8_,local_408._8_8_);
    }
    local_3a8.indirect_contents.indirect = (char *)&aStack_398;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar7->_M_dataplus)._M_p;
    paVar3 = &pbVar7->field_2;
    if (paVar8 == paVar3) {
      aStack_398._M_allocated_capacity = paVar3->_M_allocated_capacity;
      aStack_398._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    }
    else {
      aStack_398._M_allocated_capacity = paVar3->_M_allocated_capacity;
      local_3a8.indirect_contents.indirect = (char *)paVar8;
    }
    local_3a8._8_8_ = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar3;
    pbVar7->_M_string_length = 0;
    paVar3->_M_local_buf[0] = '\0';
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_3a8,".1.1");
    local_388._0_8_ = &aStack_378;
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar7->_M_dataplus)._M_p;
    paVar8 = &pbVar7->field_2;
    if (paVar3 == paVar8) {
      aStack_378._M_allocated_capacity = paVar8->_M_allocated_capacity;
      aStack_378._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    }
    else {
      aStack_378._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_388._0_8_ = paVar3;
    }
    local_388._8_8_ = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    ResolveService((CService *)&local_430.indirect_contents,(string *)local_388,0);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_430.indirect_contents);
    local_328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418;
    local_320 = local_410;
    local_318.__d.__r = (duration)100000000;
    local_310 = NODE_NONE;
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"251.4.1.1","");
    ResolveIP((CNetAddr *)&local_450,&local_470);
    AddrInfo::AddrInfo(&infoi,(CAddress *)&bucket,(CNetAddr *)&local_450);
    if (0x10 < local_440) {
      free((void *)local_450._M_allocated_capacity);
      local_450._M_allocated_capacity = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
    }
    if (0x10 < (uint)sStack_330.pi_) {
      free(_bucket);
      _bucket = (_func_int **)0x0;
    }
    if (0x10 < local_420) {
      free(local_430.indirect_contents.indirect);
      local_430.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._0_8_ != &aStack_378) {
      operator_delete((void *)local_388._0_8_,(ulong)(aStack_378._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.indirect_contents.indirect != &aStack_398) {
      operator_delete(local_3a8.indirect_contents.indirect,aStack_398._M_allocated_capacity + 1);
    }
    if ((string *)local_408._0_8_ != (string *)(local_408 + 0x10)) {
      operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8.indirect_contents.indirect != &local_3b8) {
      operator_delete(local_3c8.indirect_contents.indirect,
                      (ulong)(local_3b8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_allocated_capacity != &local_3d8) {
      operator_delete((void *)local_3e8._M_allocated_capacity,local_3d8._M_allocated_capacity + 1);
    }
    iVar5 = AddrInfo::GetNewBucket(&infoi,&nKey1,&infoi.source,&ngm_asmap);
    bucket = iVar5;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&buckets,
               &bucket);
    if (0x10 < infoi.source.m_addr._size) {
      free(infoi.source.m_addr._union.indirect_contents.indirect);
      infoi.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
    }
    if (0x10 < infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._size) {
      free(infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
           indirect);
      infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
           (char *)0x0;
    }
    uVar9 = (uint)uVar10 + 1;
    uVar10 = (ulong)uVar9;
    if (uVar9 == 0x3fc) {
      local_638 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_630 = "";
      local_648 = &boost::unit_test::basic_cstring<char_const>::null;
      local_640 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar17 = 0x23d8a1;
      file_05.m_end = (iterator)0x2af;
      file_05.m_begin = (iterator)&local_638;
      msg_05.m_end = pvVar13;
      msg_05.m_begin = pcVar14;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_648,
                 msg_05);
      bucket._0_1_ = buckets._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x41;
      local_338 = (element_type *)0x0;
      sStack_330.pi_ = (sp_counted_base *)0x0;
      local_388._0_8_ = "buckets.size() <= 64";
      local_388._8_8_ = "";
      infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
           infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ &
           0xffffffffffffff00;
      infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
           "@;\x1f";
      infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
           boost::unit_test::lazy_ostream::inst;
      infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = local_388;
      local_658 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_650 = "";
      pvVar13 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&bucket,(lazy_ostream *)&infoi,1,0,WARN,_cVar17,
                 (size_t)&local_658,0x2af);
      boost::detail::shared_count::~shared_count(&sStack_330);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                (&buckets._M_t);
      local_450._M_allocated_capacity = local_450._M_allocated_capacity & 0xffffffff00000000;
      do {
        local_388._0_8_ = &aStack_378;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"250.1.1.1","");
        ResolveService((CService *)&local_498.indirect_contents,(string *)local_388,0);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_498.indirect_contents)
        ;
        local_328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_480;
        local_320 = local_478;
        local_318.__d.__r = (duration)100000000;
        local_310 = NODE_NONE;
        util::ToString<int>((string *)local_408,(int *)local_450._M_local_buf);
        pvVar15 = (iterator)0x4;
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace((string *)local_408,0,0,"101.",4);
        local_3e8._M_allocated_capacity = (size_type)&local_3d8;
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if (paVar3 == paVar8) {
          local_3d8._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_3d8._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_3d8._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_3e8._M_allocated_capacity = (size_type)paVar3;
        }
        local_3e8._8_8_ = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_3e8,".1.1");
        local_3c8.indirect_contents.indirect = (char *)&local_3b8;
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if (paVar3 == paVar8) {
          local_3b8._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_3b8._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_3b8._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_3c8.indirect_contents.indirect = (char *)paVar3;
        }
        local_3c8._8_8_ = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        ResolveIP((CNetAddr *)&local_3a8,(string *)&local_3c8);
        AddrInfo::AddrInfo(&infoi,(CAddress *)&bucket,(CNetAddr *)&local_3a8);
        if (0x10 < (uint)aStack_398._M_allocated_capacity._0_4_) {
          free(local_3a8.indirect_contents.indirect);
          local_3a8.indirect_contents.indirect = (char *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8.indirect_contents.indirect != &local_3b8) {
          operator_delete(local_3c8.indirect_contents.indirect,
                          (ulong)(local_3b8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_allocated_capacity != &local_3d8) {
          operator_delete((void *)local_3e8._M_allocated_capacity,
                          local_3d8._M_allocated_capacity + 1);
        }
        if ((string *)local_408._0_8_ != (string *)(local_408 + 0x10)) {
          operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
        }
        if (0x10 < (uint)sStack_330.pi_) {
          free(_bucket);
          _bucket = (_func_int **)0x0;
        }
        if (0x10 < local_488) {
          free(local_498.indirect_contents.indirect);
          local_498.indirect_contents.indirect = (char *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._0_8_ != &aStack_378) {
          operator_delete((void *)local_388._0_8_,(ulong)(aStack_378._M_allocated_capacity + 1));
        }
        iVar5 = AddrInfo::GetNewBucket(&infoi,&nKey1,&infoi.source,&ngm_asmap);
        bucket = iVar5;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &buckets,&bucket);
        if (0x10 < infoi.source.m_addr._size) {
          free(infoi.source.m_addr._union.indirect_contents.indirect);
          infoi.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
        }
        if (0x10 < infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._size) {
          free(infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
               indirect);
          infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
          indirect = (char *)0x0;
        }
        uVar4 = local_450._M_allocated_capacity._0_4_;
        local_450._M_allocated_capacity._0_4_ = local_450._M_allocated_capacity._0_4_ + 1;
      } while ((int)uVar4 < 0xfe);
      local_668 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_660 = "";
      local_678 = &boost::unit_test::basic_cstring<char_const>::null;
      local_670 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar17 = 0x23dcd9;
      file_06.m_end = (iterator)0x2bb;
      file_06.m_begin = (iterator)&local_668;
      msg_06.m_end = pvVar13;
      msg_06.m_begin = pvVar15;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_678,
                 msg_06);
      bucket._0_1_ = 1 < buckets._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_338 = (element_type *)0x0;
      sStack_330.pi_ = (sp_counted_base *)0x0;
      local_388._0_8_ = "buckets.size() > 1";
      local_388._8_8_ = "";
      infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
           infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ &
           0xffffffffffffff00;
      infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
           "@;\x1f";
      infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_688 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_680 = "";
      pvVar13 = (iterator)0x0;
      infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = (string *)local_388;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&bucket,(lazy_ostream *)&infoi,1,0,WARN,_cVar17,
                 (size_t)&local_688,699);
      boost::detail::shared_count::~shared_count(&sStack_330);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                (&buckets._M_t);
      local_450._M_allocated_capacity = local_450._M_allocated_capacity & 0xffffffff00000000;
      do {
        local_388._0_8_ = &aStack_378;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"250.1.1.1","");
        ResolveService((CService *)&local_4c0.indirect_contents,(string *)local_388,0);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_4c0.indirect_contents)
        ;
        local_328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4a8;
        local_320 = local_4a0;
        local_318.__d.__r = (duration)100000000;
        local_310 = NODE_NONE;
        util::ToString<int>((string *)local_408,(int *)local_450._M_local_buf);
        pvVar15 = (iterator)0x4;
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace((string *)local_408,0,0,"250.",4);
        local_3e8._M_allocated_capacity = (size_type)&local_3d8;
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if (paVar3 == paVar8) {
          local_3d8._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_3d8._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_3d8._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_3e8._M_allocated_capacity = (size_type)paVar3;
        }
        local_3e8._8_8_ = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_3e8,".1.1");
        local_3c8.indirect_contents.indirect = (char *)&local_3b8;
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if (paVar3 == paVar8) {
          local_3b8._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_3b8._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_3b8._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_3c8.indirect_contents.indirect = (char *)paVar3;
        }
        local_3c8._8_8_ = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        ResolveIP((CNetAddr *)&local_3a8,(string *)&local_3c8);
        AddrInfo::AddrInfo(&infoi,(CAddress *)&bucket,(CNetAddr *)&local_3a8);
        if (0x10 < (uint)aStack_398._M_allocated_capacity._0_4_) {
          free(local_3a8.indirect_contents.indirect);
          local_3a8.indirect_contents.indirect = (char *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8.indirect_contents.indirect != &local_3b8) {
          operator_delete(local_3c8.indirect_contents.indirect,
                          (ulong)(local_3b8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_allocated_capacity != &local_3d8) {
          operator_delete((void *)local_3e8._M_allocated_capacity,
                          local_3d8._M_allocated_capacity + 1);
        }
        if ((string *)local_408._0_8_ != (string *)(local_408 + 0x10)) {
          operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
        }
        if (0x10 < (uint)sStack_330.pi_) {
          free(_bucket);
          _bucket = (_func_int **)0x0;
        }
        if (0x10 < local_4b0) {
          free(local_4c0.indirect_contents.indirect);
          local_4c0.indirect_contents.indirect = (char *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._0_8_ != &aStack_378) {
          operator_delete((void *)local_388._0_8_,(ulong)(aStack_378._M_allocated_capacity + 1));
        }
        iVar5 = AddrInfo::GetNewBucket(&infoi,&nKey1,&infoi.source,&ngm_asmap);
        bucket = iVar5;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &buckets,&bucket);
        if (0x10 < infoi.source.m_addr._size) {
          free(infoi.source.m_addr._union.indirect_contents.indirect);
          infoi.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
        }
        if (0x10 < infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._size) {
          free(infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
               indirect);
          infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
          indirect = (char *)0x0;
        }
        uVar4 = local_450._M_allocated_capacity._0_4_;
        local_450._M_allocated_capacity._0_4_ = local_450._M_allocated_capacity._0_4_ + 1;
      } while ((int)uVar4 < 0xfe);
      local_698 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_690 = "";
      local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar17 = 0x23e109;
      file_07.m_end = (iterator)0x2c7;
      file_07.m_begin = (iterator)&local_698;
      msg_07.m_end = pvVar13;
      msg_07.m_begin = pvVar15;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_6a8,
                 msg_07);
      bucket._0_1_ = buckets._M_t._M_impl.super__Rb_tree_header._M_node_count == 1;
      local_338 = (element_type *)0x0;
      sStack_330.pi_ = (sp_counted_base *)0x0;
      local_388._0_8_ = "buckets.size() == 1";
      local_388._8_8_ = "";
      infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
           infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ &
           0xffffffffffffff00;
      infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
           "@;\x1f";
      infoi.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
           boost::unit_test::lazy_ostream::inst;
      local_6b8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_6b0 = "";
      infoi.super_CAddress.super_CService.super_CNetAddr._24_8_ = (string *)local_388;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&bucket,(lazy_ostream *)&infoi,1,0,WARN,_cVar17,
                 (size_t)&local_6b8,0x2c7);
      boost::detail::shared_count::~shared_count(&sStack_330);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&buckets._M_t);
      if (0x10 < info2.source.m_addr._size) {
        free(info2.source.m_addr._union.indirect_contents.indirect);
        info2.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < info2.super_CAddress.super_CService.super_CNetAddr.m_addr._size) {
        free(info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
             indirect);
        info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect
             = (char *)0x0;
      }
      if (0x10 < info1.source.m_addr._size) {
        free(info1.source.m_addr._union.indirect_contents.indirect);
        info1.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < info1.super_CAddress.super_CService.super_CNetAddr.m_addr._size) {
        free(info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
             indirect);
        info1.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect
             = (char *)0x0;
      }
      if (0x10 < source1.m_addr._size) {
        free(source1.m_addr._union.indirect_contents.indirect);
        source1.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < addr2.super_CService.super_CNetAddr.m_addr._size) {
        free(addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
        addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < addr1.super_CService.super_CNetAddr.m_addr._size) {
        free(addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
        addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      if (ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
        ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
        ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      }
      if (asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
          .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_offset = 0;
        asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
        super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
        super__Bit_iterator_base._M_offset = 0;
        asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(caddrinfo_get_new_bucket)
{
    std::vector<bool> asmap = FromBytes(test::data::asmap);
    NetGroupManager ngm_asmap{asmap};

    CAddress addr1 = CAddress(ResolveService("250.1.2.1", 8333), NODE_NONE);
    CAddress addr2 = CAddress(ResolveService("250.1.2.1", 9999), NODE_NONE);

    CNetAddr source1 = ResolveIP("250.1.2.1");

    AddrInfo info1 = AddrInfo(addr1, source1);

    uint256 nKey1 = (HashWriter{} << 1).GetHash();
    uint256 nKey2 = (HashWriter{} << 2).GetHash();

    // Test: Make sure the buckets are what we expect
    BOOST_CHECK_EQUAL(info1.GetNewBucket(nKey1, ngm_asmap), 795);
    BOOST_CHECK_EQUAL(info1.GetNewBucket(nKey1, source1, ngm_asmap), 795);

    // Test: Make sure key actually randomizes bucket placement. A fail on
    //  this test could be a security issue.
    BOOST_CHECK(info1.GetNewBucket(nKey1, ngm_asmap) != info1.GetNewBucket(nKey2, ngm_asmap));

    // Test: Ports should not affect bucket placement in the addr
    AddrInfo info2 = AddrInfo(addr2, source1);
    BOOST_CHECK(info1.GetKey() != info2.GetKey());
    BOOST_CHECK_EQUAL(info1.GetNewBucket(nKey1, ngm_asmap), info2.GetNewBucket(nKey1, ngm_asmap));

    std::set<int> buckets;
    for (int i = 0; i < 255; i++) {
        AddrInfo infoi = AddrInfo(
            CAddress(ResolveService("250.1.1." + ToString(i)), NODE_NONE),
            ResolveIP("250.1.1." + ToString(i)));
        int bucket = infoi.GetNewBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the same /16 prefix
    // usually map to the same bucket.
    BOOST_CHECK_EQUAL(buckets.size(), 1U);

    buckets.clear();
    for (int j = 0; j < 4 * 255; j++) {
        AddrInfo infoj = AddrInfo(CAddress(
                                        ResolveService(
                                            ToString(250 + (j / 255)) + "." + ToString(j % 256) + ".1.1"), NODE_NONE),
            ResolveIP("251.4.1.1"));
        int bucket = infoj.GetNewBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the same source /16 prefix should not map to more
    // than 64 buckets.
    BOOST_CHECK(buckets.size() <= 64);

    buckets.clear();
    for (int p = 0; p < 255; p++) {
        AddrInfo infoj = AddrInfo(
            CAddress(ResolveService("250.1.1.1"), NODE_NONE),
            ResolveIP("101." + ToString(p) + ".1.1"));
        int bucket = infoj.GetNewBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the different source /16 prefixes usually map to MORE
    // than 1 bucket.
    BOOST_CHECK(buckets.size() > 1);

    buckets.clear();
    for (int p = 0; p < 255; p++) {
        AddrInfo infoj = AddrInfo(
            CAddress(ResolveService("250.1.1.1"), NODE_NONE),
            ResolveIP("250." + ToString(p) + ".1.1"));
        int bucket = infoj.GetNewBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the different source /16 prefixes sometimes map to NO MORE
    // than 1 bucket.
    BOOST_CHECK(buckets.size() == 1);
}